

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

vector<folding_info,_std::allocator<folding_info>_> *
read_CaseFolding_txt
          (vector<folding_info,_std::allocator<folding_info>_> *__return_storage_ptr__,
          char *filename)

{
  pointer *this;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  char *pcVar5;
  char *pcVar6;
  size_type sVar7;
  byte local_2c2;
  value_type local_28c;
  folding_info info;
  undefined1 local_270 [8];
  container_type split_line;
  string line;
  istream local_228 [8];
  ifstream file;
  char *filename_local;
  vector<folding_info,_std::allocator<folding_info>_> *result;
  
  std::vector<folding_info,_std::allocator<folding_info>_>::vector(__return_storage_ptr__);
  std::ifstream::ifstream(local_228,filename,_S_in);
  do {
    bVar1 = std::ios::good();
    local_2c2 = 0;
    if ((bVar1 & 1) != 0) {
      local_2c2 = std::ios::eof();
      local_2c2 = local_2c2 ^ 0xff;
    }
    if ((local_2c2 & 1) == 0) {
      info.in_codepoint = 1;
      std::ifstream::~ifstream(local_228);
      return __return_storage_ptr__;
    }
    this = &split_line.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)this);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,(string *)this);
    join_0x00000010_0x00000000_ = sv("; ",2);
    jessilib::
    split<std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
              ((container_type *)local_270,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &split_line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (basic_string_view<char,_std::char_traits<char>_> *)&info.out_codepoint);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_270);
    if (sVar3 < 3) {
      info.in_codepoint = 2;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_270,1);
      bVar2 = std::operator==(pvVar4,"C");
      if (bVar2) {
LAB_00339ffc:
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,0);
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,0);
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,0);
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(pvVar4);
        std::from_chars<unsigned_int>(pcVar5,pcVar6 + sVar7,&local_28c.in_codepoint,0x10);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,2);
        pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,2);
        pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data(pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,2);
        sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(pvVar4);
        std::from_chars<unsigned_int>(pcVar5,pcVar6 + sVar7,&local_28c.out_codepoint,0x10);
        std::vector<folding_info,_std::allocator<folding_info>_>::push_back
                  (__return_storage_ptr__,&local_28c);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_270,1);
        bVar2 = std::operator==(pvVar4,"S");
        if (bVar2) goto LAB_00339ffc;
      }
      info.in_codepoint = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_270);
    std::__cxx11::string::~string
              ((string *)
               &split_line.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  } while( true );
}

Assistant:

std::vector<folding_info> read_CaseFolding_txt(const char* filename = JESSITEST_DATA_DIR "CaseFolding.txt") {
	std::vector<folding_info> result;
	std::ifstream file{ filename };

	while (file.good() && !file.eof()) {
		std::string line;
		std::getline(file, line);
		auto split_line = jessilib::split(line, "; "sv);
		if (split_line.size() < 3) {
			continue;
		}

		// From CaseFolding.txt usage; we're doing simple case folding:
		// "A. To do a simple case folding, use the mappings with status C + S."
		// "B. To do a full case folding, use the mappings with status C + F."
		if (split_line[1] == "C" || split_line[1] == "S") {
			folding_info info;
			std::from_chars(split_line[0].data(), split_line[0].data() + split_line[0].size(), info.in_codepoint, 16);
			std::from_chars(split_line[2].data(), split_line[2].data() + split_line[2].size(), info.out_codepoint, 16);
			result.push_back(info);
		}
		//else {
		//	std::cout << "ignoring: " << line << std::endl;
		//}
	}

	return result;
}